

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strnterminate_s.c
# Opt level: O0

rsize_t strnterminate_s(char *dest,rsize_t dmax)

{
  long lVar1;
  ulong in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  rsize_t count;
  errno_t in_stack_ffffffffffffffcc;
  void *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  ulong local_20;
  char *local_18;
  rsize_t local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (char *)0x0) {
    local_10 = 0;
  }
  else if (in_RSI == 0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    local_10 = 0;
  }
  else if (in_RSI < 0x10000001) {
    local_10 = 0;
    local_20 = in_RSI;
    for (local_18 = in_RDI; (1 < local_20 && (*local_18 != '\0')); local_18 = local_18 + 1) {
      local_10 = local_10 + 1;
      local_20 = local_20 - 1;
    }
    *local_18 = '\0';
  }
  else {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    local_10 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

rsize_t
strnterminate_s (char *dest, rsize_t dmax)
{
    rsize_t count;

    if (dest == NULL) {
        return (0);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strnterminate_s: dmax is 0",
                   NULL, ESZEROL);
        return (0);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strnterminate_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (0);
    }

    count = 0;
    while (dmax > 1) {
        if (*dest) {
            count++;
            dmax--;
            dest++;
        } else {
            break;
        }
    }
    *dest = '\0';

    return (count);
}